

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

DynamicObject * __thiscall
JsrtDebugManager::GetSource(JsrtDebugManager *this,ScriptContext *scriptContext,uint scriptId)

{
  anon_class_16_2_85121e8d_for_mapper mapper;
  int iVar1;
  ScriptContext *scriptContext_00;
  JavascriptLibrary *this_00;
  DynamicObject *value;
  byte local_49;
  DynamicObject *local_48;
  DynamicObject *sourceObject;
  ScriptContext *local_30;
  ScriptContext *tempScriptContext;
  Utf8SourceInfo *utf8SourceInfo;
  ScriptContext *pSStack_18;
  uint scriptId_local;
  ScriptContext *scriptContext_local;
  JsrtDebugManager *this_local;
  
  tempScriptContext = (ScriptContext *)0x0;
  utf8SourceInfo._4_4_ = scriptId;
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  local_30 = ThreadContext::GetScriptContextList(this->threadContext);
  while( true ) {
    local_49 = 0;
    if ((local_30 != (ScriptContext *)0x0) &&
       (local_49 = 0, tempScriptContext == (ScriptContext *)0x0)) {
      iVar1 = (*(local_30->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
      local_49 = (byte)iVar1 ^ 0xff;
    }
    if ((local_49 & 1) == 0) break;
    mapper.utf8SourceInfo = (Utf8SourceInfo **)&tempScriptContext;
    mapper.scriptId = (uint *)((long)&utf8SourceInfo + 4);
    Js::ScriptContext::MapScript<JsrtDebugManager::GetSource(Js::ScriptContext*,unsigned_int)::__0>
              (local_30,mapper);
    local_30 = local_30->next;
  }
  local_48 = (DynamicObject *)0x0;
  if (tempScriptContext != (ScriptContext *)0x0) {
    scriptContext_00 = Js::Utf8SourceInfo::GetScriptContext((Utf8SourceInfo *)tempScriptContext);
    this_00 = Js::ScriptContext::GetLibrary(pSStack_18);
    value = Js::JavascriptLibrary::CreateObject(this_00,false,0);
    local_48 = (DynamicObject *)Js::CrossSite::MarshalVar(scriptContext_00,value,false);
    JsrtDebugUtils::AddSourceMetadataToObject(local_48,(Utf8SourceInfo *)tempScriptContext);
    JsrtDebugUtils::AddSourceToObject(local_48,(Utf8SourceInfo *)tempScriptContext);
  }
  return local_48;
}

Assistant:

Js::DynamicObject* JsrtDebugManager::GetSource(Js::ScriptContext* scriptContext, uint scriptId)
{
    Js::Utf8SourceInfo* utf8SourceInfo = nullptr;

    for (Js::ScriptContext *tempScriptContext = this->threadContext->GetScriptContextList();
    tempScriptContext != nullptr && utf8SourceInfo == nullptr && !tempScriptContext->IsClosed();
        tempScriptContext = tempScriptContext->next)
    {
        tempScriptContext->MapScript([&](Js::Utf8SourceInfo* sourceInfo) -> bool
        {
            if (sourceInfo->IsInDebugMode() && sourceInfo->GetSourceInfoId() == scriptId)
            {
                utf8SourceInfo = sourceInfo;
                return true;
            }
            return false;
        });
    }

    Js::DynamicObject* sourceObject = nullptr;

    if (utf8SourceInfo != nullptr)
    {
        sourceObject = (Js::DynamicObject*)Js::CrossSite::MarshalVar(utf8SourceInfo->GetScriptContext(), scriptContext->GetLibrary()->CreateObject());

        JsrtDebugUtils::AddSourceMetadataToObject(sourceObject, utf8SourceInfo);
        JsrtDebugUtils::AddSourceToObject(sourceObject, utf8SourceInfo);
    }

    return sourceObject;
}